

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

double __thiscall
anon_unknown.dwarf_d7297f::IntersectionPoint::round(IntersectionPoint *this,double __x)

{
  long lVar1;
  int *piVar2;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar3;
  QPoint result;
  undefined8 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPoint::QPoint((QPoint *)this,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                 (int)in_stack_ffffffffffffffd8);
  dVar3 = extraout_XMM0_Qa;
  if ((this->x).fraction.denominator <= (this->x).fraction.numerator << 1) {
    piVar2 = QPoint::rx((QPoint *)0x5ea935);
    *piVar2 = *piVar2 + 1;
    dVar3 = extraout_XMM0_Qa_00;
  }
  if ((this->y).fraction.denominator <= (this->y).fraction.numerator << 1) {
    piVar2 = QPoint::ry((QPoint *)0x5ea955);
    *piVar2 = *piVar2 + 1;
    dVar3 = extraout_XMM0_Qa_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return dVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPoint IntersectionPoint::round() const
{
    QPoint result(x.integer, y.integer);
    if (2 * x.fraction.numerator >= x.fraction.denominator)
        ++result.rx();
    if (2 * y.fraction.numerator >= y.fraction.denominator)
        ++result.ry();
    return result;
}